

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedCommand(SelectionEvaluator *this,Token *token)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long *local_38 [2];
  long local_28 [2];
  
  plVar1 = (long *)std::__any_caster<std::__cxx11::string>(&token->value);
  if (plVar1 != (long *)0x0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>((string *)local_38,*plVar1,plVar1[1] + *plVar1);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x2a136d);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_48 = *plVar2;
      uStack_40 = (undefined4)plVar1[3];
      uStack_3c = *(undefined4 *)((long)plVar1 + 0x1c);
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar2;
      local_58 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_58);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    return;
  }
  std::__throw_bad_any_cast();
}

Assistant:

void unrecognizedCommand(const Token& token) {
      evalError("unrecognized command:" +
                std::any_cast<std::string>(token.value));
    }